

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

int anon_unknown.dwarf_26820::run_insertion(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  ostream *poVar5;
  pointer pDVar6;
  long in_RSI;
  int in_EDI;
  double dVar7;
  ofstream ofs;
  string dic_name;
  char *key;
  uint32_t N;
  StopWatch sw;
  KeyReader reader;
  int i;
  vector<const_char_*,_std::allocator<const_char_*>_> prefixes;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> dic;
  KeyReader *in_stack_fffffffffffffa38;
  KeyReader *in_stack_fffffffffffffa40;
  value_type *in_stack_fffffffffffffa48;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffa50;
  char *in_stack_fffffffffffffa58;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  undefined8 in_stack_fffffffffffffa78;
  Times type;
  StopWatch *in_stack_fffffffffffffa80;
  string *in_stack_fffffffffffffa88;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  long local_510 [2];
  undefined1 in_stack_fffffffffffffb07;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *in_stack_fffffffffffffb08;
  ostream *in_stack_fffffffffffffb10;
  allocator local_309;
  string local_308 [32];
  char *local_2e8;
  uint local_2dc;
  StopWatch local_2d8 [70];
  uint local_a8;
  allocator local_a1;
  string local_a0 [44];
  int local_74;
  allocator local_41;
  string local_40 [48];
  long local_10;
  int local_8;
  int local_4;
  
  local_10 = in_RSI;
  local_8 = in_EDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"run insertion");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if (local_8 < 5) {
    show_usage((ostream *)0x1499fe);
    local_4 = 1;
  }
  else {
    std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
    unique_ptr<std::default_delete<ddd::Dictionary>,void>
              ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
               in_stack_fffffffffffffa40);
    if (local_8 == 5) {
      pcVar1 = *(char **)(local_10 + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar1,&local_41);
      create_dic(in_stack_fffffffffffffa88);
      std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::operator=
                ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                 in_stack_fffffffffffffa40,
                 (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                 in_stack_fffffffffffffa38);
      std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::~unique_ptr
                ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                 in_stack_fffffffffffffa40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    else {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x149b1f);
      for (local_74 = 5; local_74 < local_8; local_74 = local_74 + 1) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
      }
      pcVar1 = *(char **)(local_10 + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,pcVar1,&local_a1);
      create_dic((string *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                 in_stack_fffffffffffffaa0);
      std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::operator=
                ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                 in_stack_fffffffffffffa40,
                 (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                 in_stack_fffffffffffffa38);
      std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::~unique_ptr
                ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                 in_stack_fffffffffffffa40);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(in_stack_fffffffffffffa50);
    }
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                       0x149ca0);
    if (bVar2) {
      KeyReader::KeyReader
                ((KeyReader *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                 in_stack_fffffffffffffa58);
      bVar2 = KeyReader::is_ready((KeyReader *)0x149d0e);
      if (bVar2) {
        StopWatch::StopWatch((StopWatch *)in_stack_fffffffffffffa40);
        local_2dc = 0;
        do {
          local_2e8 = KeyReader::next(in_stack_fffffffffffffa38);
          type = (Times)((ulong)in_stack_fffffffffffffa78 >> 0x20);
          if (local_2e8 == (char *)0x0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"- insertion time: ");
            dVar7 = StopWatch::operator()(in_stack_fffffffffffffa80,type);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7 / (double)local_2dc);
            poVar5 = std::operator<<(poVar5," us / key");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            local_a8 = 0;
            goto LAB_00149f60;
          }
          pDVar6 = std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::
                   operator->((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                              0x149e09);
          local_2dc = local_2dc + 1;
          uVar4 = (*pDVar6->_vptr_Dictionary[4])(pDVar6,local_2e8);
        } while ((uVar4 & 1) != 0);
        poVar5 = std::operator<<((ostream *)&std::cerr,"failed to insert ");
        poVar5 = std::operator<<(poVar5,local_2e8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        local_4 = 1;
        local_a8 = 1;
LAB_00149f60:
        StopWatch::~StopWatch(local_2d8);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"failed to open ");
        poVar5 = std::operator<<(poVar5,*(char **)(local_10 + 0x20));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        local_4 = 1;
        local_a8 = 1;
      }
      KeyReader::~KeyReader(in_stack_fffffffffffffa40);
      if (local_a8 == 0) {
        show_stat(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                  (bool)in_stack_fffffffffffffb07);
        pcVar1 = *(char **)(local_10 + 0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_308,pcVar1,&local_309);
        std::allocator<char>::~allocator((allocator<char> *)&local_309);
        std::__cxx11::string::operator+=(local_308,".");
        std::__cxx11::string::operator+=(local_308,*(char **)(local_10 + 0x10));
        std::ofstream::ofstream(local_510,local_308,0x10);
        bVar3 = std::ios::operator!((ios *)((long)local_510 + *(long *)(local_510[0] + -0x18)));
        bVar2 = (bVar3 & 1) != 0;
        if (bVar2) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"failed to open ");
          poVar5 = std::operator<<(poVar5,local_308);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          local_4 = 1;
        }
        else {
          pDVar6 = std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::
                   operator->((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                              0x14a14d);
          (*pDVar6->_vptr_Dictionary[0xc])(pDVar6,local_510);
        }
        local_a8 = (uint)bVar2;
        std::ofstream::~ofstream(local_510);
        if (local_a8 == 0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"write dic to ");
          in_stack_fffffffffffffa40 = (KeyReader *)std::operator<<(poVar5,local_308);
          std::ostream::operator<<(in_stack_fffffffffffffa40,std::endl<char,std::char_traits<char>>)
          ;
          local_4 = 0;
          local_a8 = 1;
        }
        std::__cxx11::string::~string(local_308);
      }
    }
    else {
      show_usage((ostream *)0x149cb0);
      local_4 = 1;
      local_a8 = 1;
    }
    std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::~unique_ptr
              ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
               in_stack_fffffffffffffa40);
  }
  return local_4;
}

Assistant:

int run_insertion(int argc, const char* argv[]) {
  std::cout << "run insertion" << std::endl;

  if (argc < 5) {
    show_usage(std::cerr);
    return 1;
  }

  std::unique_ptr<Dictionary> dic;
  if (argc == 5) {
    dic = create_dic(argv[2]);
  } else {
    std::vector<const char*> prefixes;
    for (int i = 5; i < argc; ++i) {
      prefixes.push_back(argv[i]);
    }
    dic = create_dic(argv[2], prefixes);
  }
  if (!dic) {
    show_usage(std::cerr);
    return 1;
  }

  {
    KeyReader reader{argv[4]};
    if (!reader.is_ready()) {
      std::cerr << "failed to open " << argv[4] << std::endl;
      return 1;
    }

    StopWatch sw;
    uint32_t N = 0;

    while (auto key = reader.next()) {
      if (!dic->insert_key(key, N++)) {
        std::cerr << "failed to insert " << key << std::endl;
        return 1;
      }
    }
    std::cout << "- insertion time: " << sw(Times::micro) / N << " us / key" << std::endl;
  }

  show_stat(std::cout, dic, true);

  std::string dic_name{argv[3]};
  dic_name += ".";
  dic_name += argv[2];

  {
    std::ofstream ofs{dic_name};
    if (!ofs) {
      std::cerr << "failed to open " << dic_name << std::endl;
      return 1;
    }
    dic->write(ofs);
  }

  std::cout << "write dic to " << dic_name << std::endl;
  return 0;
}